

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.cc
# Opt level: O3

span<const_lf::mesh::Entity_*const,_18446744073709551615UL> __thiscall
lf::mesh::hybrid2d::Segment::SubEntities(Segment *this,uint rel_codim)

{
  long lVar1;
  runtime_error *this_00;
  __extent_storage<18446744073709551615UL> _Var2;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> sVar3;
  stringstream ss;
  string local_200;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if (rel_codim == 1) {
    _Var2._M_extent_value = 2;
    lVar1 = 0x18;
  }
  else {
    if (rel_codim != 0) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_190,"Segment: rel_codim out of range",0x1f);
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"false","");
      local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/segment.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed(&local_1e0,&local_200,0x18,&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"this code should not be reached");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    _Var2._M_extent_value = 1;
    lVar1 = 0x28;
  }
  sVar3._M_extent._M_extent_value = _Var2._M_extent_value;
  sVar3._M_ptr = (pointer)((long)(this->nodes_)._M_elems + lVar1 + -0x18);
  return sVar3;
}

Assistant:

std::span<const Entity* const> Segment::SubEntities(unsigned rel_codim) const {
  // An impressive way to do double dereferencing!
  auto l = [&](auto i) -> const mesh::Entity& { return **i; };
  if (rel_codim == 1) {
    return {reinterpret_cast<const Entity* const*>(nodes_.data()), 2};
  }
  // If the segment itself is requested return reference to itself
  if (rel_codim == 0) {
    return {&this_, 1};
  }
  LF_VERIFY_MSG(false, "Segment: rel_codim out of range");
}